

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::LoadableGetStateBlock_x
          (ChElementShellANCF_3443 *this,int block_offset,ChState *mD)

{
  double *pdVar1;
  pointer psVar2;
  double *pdVar3;
  element_type *peVar4;
  long lVar5;
  Index index_15;
  Index index_12;
  Index index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (block_offset < 0) goto LAB_0077ac91;
  lVar5 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar5 < block_offset) goto LAB_0077ac91;
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  peVar4 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pdVar1 = pdVar3 + block_offset;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a595;
  }
  else {
LAB_0077a595:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  uVar6 = (ulong)(uint)block_offset;
  if (lVar5 < (long)(uVar6 + 3)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 3;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a604;
  }
  else {
LAB_0077a604:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 6)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 6;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a677;
  }
  else {
LAB_0077a677:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 9)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 9;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a6ea;
  }
  else {
LAB_0077a6ea:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0xc)) goto LAB_0077ac91;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0xc;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a761;
  }
  else {
LAB_0077a761:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0xf)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0xf;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a7ce;
  }
  else {
LAB_0077a7ce:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x12)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0x12;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a844;
  }
  else {
LAB_0077a844:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x15)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0x15;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a8ba;
  }
  else {
LAB_0077a8ba:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x18)) goto LAB_0077ac91;
  peVar4 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x18;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a934;
  }
  else {
LAB_0077a934:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x1b)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0x1b;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077a9a4;
  }
  else {
LAB_0077a9a4:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x1e)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0x1e;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077aa1a;
  }
  else {
LAB_0077aa1a:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x21)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0x21;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077aa90;
  }
  else {
LAB_0077aa90:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->DDD_dt + uVar9 * 8 + 0xffffffffffffffe8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x24)) goto LAB_0077ac91;
  peVar4 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 0x24;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077ab0a;
  }
  else {
LAB_0077ab0a:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x27)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0x27;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077ab7a;
  }
  else {
LAB_0077ab7a:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0xf0);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x2a)) goto LAB_0077ac91;
  pdVar1 = pdVar3 + uVar6 + 0x2a;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0077abf0;
  }
  else {
LAB_0077abf0:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar9 * 8 + 0x140);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzDD + uVar8 * 8 + 0x140);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x2d)) {
LAB_0077ac91:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = pdVar3 + uVar6 + 0x2d;
  uVar6 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_0077ac72;
  }
  uVar8 = 0;
  do {
    pdVar3[uVar8] = *(double *)((long)&peVar4->DDD_dt + uVar8 * 8 + 0xffffffffffffffe8);
    uVar8 = uVar8 + 1;
  } while (uVar6 != uVar8);
LAB_0077ac72:
  if (uVar6 < 3) {
    do {
      pdVar3[uVar6] = *(double *)((long)&peVar4->DDD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[0]->GetDD().eigen();
    mD.segment(block_offset + 9, 3) = m_nodes[0]->GetDDD().eigen();

    mD.segment(block_offset + 12, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(block_offset + 18, 3) = m_nodes[1]->GetDD().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[1]->GetDDD().eigen();

    mD.segment(block_offset + 24, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 27, 3) = m_nodes[2]->GetD().eigen();
    mD.segment(block_offset + 30, 3) = m_nodes[2]->GetDD().eigen();
    mD.segment(block_offset + 33, 3) = m_nodes[2]->GetDDD().eigen();

    mD.segment(block_offset + 36, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(block_offset + 39, 3) = m_nodes[3]->GetD().eigen();
    mD.segment(block_offset + 42, 3) = m_nodes[3]->GetDD().eigen();
    mD.segment(block_offset + 45, 3) = m_nodes[3]->GetDDD().eigen();
}